

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O1

PSNode * __thiscall
dg::pta::PointerGraph::
create<(dg::pta::PSNodeType)20,dg::pta::PSNodeAlloc*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&>
          (PointerGraph *this,PSNodeAlloc **args,PSNodeAlloc **args_1,unsigned_long *args_2)

{
  int iVar1;
  iterator __position;
  PSNodeMemcpy *this_00;
  PSNode *n;
  _Head_base<0UL,_dg::pta::PSNode_*,_false> local_30;
  
  this_00 = (PSNodeMemcpy *)operator_new(0xf0);
  iVar1 = *(int *)(this + 0x40);
  *(IDType *)(this + 0x40) = iVar1 + 1U;
  PSNodeMemcpy::PSNodeMemcpy
            (this_00,iVar1 + 1U,&(*args)->super_PSNode,&(*args_1)->super_PSNode,(Offset)*args_2);
  __position._M_current =
       *(unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> **)(this + 0x18);
  local_30._M_head_impl = (PSNode *)this_00;
  if (__position._M_current ==
      *(unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> **)(this + 0x20)) {
    std::
    vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
    ::_M_realloc_insert<dg::pta::PSNode*&>
              ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
                *)(this + 0x10),__position,&local_30._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
    super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl = (PSNode *)this_00;
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 8;
  }
  return &((PSNodeMemcpy *)local_30._M_head_impl)->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }